

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint-hash.c
# Opt level: O0

void Curl_uint_hash_init(uint_hash *h,uint slots,Curl_uint_hash_dtor *dtor)

{
  Curl_uint_hash_dtor *dtor_local;
  uint slots_local;
  uint_hash *h_local;
  
  h->table = (uint_hash_entry **)0x0;
  h->dtor = dtor;
  h->size = 0;
  h->slots = slots;
  return;
}

Assistant:

void Curl_uint_hash_init(struct uint_hash *h,
                         unsigned int slots,
                         Curl_uint_hash_dtor *dtor)
{
  DEBUGASSERT(h);
  DEBUGASSERT(slots);

  h->table = NULL;
  h->dtor = dtor;
  h->size = 0;
  h->slots = slots;
#ifdef DEBUGBUILD
  h->init = CURL_UINTHASHINIT;
#endif
}